

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryBackgroundBorder.cpp
# Opt level: O2

void __thiscall
Rml::GeometryBackgroundBorder::DrawArcPoint
          (GeometryBackgroundBorder *this,Vector2f pos_center,Vector2f pos_inner,float R,float a0,
          float a1,ColourbPremultiplied color0,ColourbPremultiplied color1,int num_points)

{
  uint uVar1;
  vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *this_00;
  Vector2f VVar2;
  vector<int,_std::allocator<int>_> *this_01;
  Vector<int> *pVVar3;
  pointer piVar4;
  code *pcVar5;
  bool bVar6;
  int iVar7;
  pointer pVVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  
  if (R <= 0.0 || num_points < 2) {
    bVar6 = Assert("RMLUI_ASSERT(R > 0 && num_points >= 2)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/GeometryBackgroundBorder.cpp"
                   ,299);
    if (!bVar6) goto LAB_002ab060;
  }
  this_00 = this->vertices;
  iVar7 = (int)(((long)(this_00->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(this_00->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x14);
  ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::reserve
            (this_00,(long)(iVar7 + num_points + 2));
  DrawPoint(this,pos_inner,color0);
  VVar2.y = R;
  VVar2.x = R;
  DrawArc(this,pos_center,VVar2,a0,a1,color0,color1,num_points);
  DrawPoint(this,pos_inner,color1);
  pVVar8 = (this->vertices->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar14 = (int)(((long)(this->vertices->
                        super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pVVar8) / 0x14);
  if (iVar14 - iVar7 != num_points + 2) {
    bVar6 = Assert("RMLUI_ASSERT((int)vertices.size() - offset_vertices == num_points + 2)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/GeometryBackgroundBorder.cpp"
                   ,0x135);
    if (!bVar6) {
LAB_002ab060:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    pVVar8 = (this->vertices->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>)._M_impl
             .super__Vector_impl_data._M_start;
    iVar14 = (int)(((long)(this->vertices->
                          super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)pVVar8) / 0x14);
  }
  iVar9 = iVar14 + -1;
  iVar14 = iVar14 + -2;
  VVar2 = pVVar8[iVar14].position;
  pVVar8[iVar14].position = pVVar8[iVar9].position;
  pVVar8[iVar9].position = VVar2;
  uVar1 = num_points - 1;
  this_01 = this->indices;
  iVar11 = (int)((ulong)((long)(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  ::std::vector<int,_std::allocator<int>_>::resize(this_01,(long)(int)(uVar1 * 3 + iVar11));
  pVVar3 = this->indices;
  uVar12 = 0;
  uVar15 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar15 = uVar12;
  }
  lVar10 = (long)iVar11 << 2;
  for (; uVar15 != uVar12; uVar12 = uVar12 + 1) {
    iVar13 = iVar7;
    if ((long)((int)uVar1 / 2) < (long)uVar12) {
      iVar13 = iVar14;
    }
    piVar4 = (pVVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    *(int *)((long)piVar4 + lVar10) = iVar13;
    *(int *)((long)piVar4 + lVar10 + 4) = iVar7 + 2 + (int)uVar12;
    *(int *)((long)piVar4 + lVar10 + 8) = iVar7 + 1 + (int)uVar12;
    lVar10 = lVar10 + 0xc;
  }
  (pVVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [(long)(num_points * 3 + iVar11 + -6) + 1] = iVar9;
  return;
}

Assistant:

void GeometryBackgroundBorder::DrawArcPoint(Vector2f pos_center, Vector2f pos_inner, float R, float a0, float a1, ColourbPremultiplied color0,
	ColourbPremultiplied color1, int num_points)
{
	RMLUI_ASSERT(R > 0 && num_points >= 2);

	const int offset_vertices = (int)vertices.size();
	vertices.reserve(offset_vertices + num_points + 2);

	// Generate the vertices. We could also split the arc mid-way to create a sharp color transition.
	DrawPoint(pos_inner, color0);
	DrawArc(pos_center, Vector2f(R), a0, a1, color0, color1, num_points);
	DrawPoint(pos_inner, color1);

	RMLUI_ASSERT((int)vertices.size() - offset_vertices == num_points + 2);

	// Swap the last two vertices such that the outer edge vertex is last, see the comment for the border drawing functions. Their colors should
	// already be the same.
	const int last_vertex = (int)vertices.size() - 1;
	std::swap(vertices[last_vertex - 1].position, vertices[last_vertex].position);

	// Generate the indices
	const int num_triangles = (num_points - 1);

	const int i_vertex_inner0 = offset_vertices;
	const int i_vertex_inner1 = last_vertex - 1;

	const int offset_indices = (int)indices.size();
	indices.resize(offset_indices + 3 * num_triangles);

	for (int i = 0; i < num_triangles; i++)
	{
		indices[offset_indices + 3 * i + 0] = (i > num_triangles / 2 ? i_vertex_inner1 : i_vertex_inner0);
		indices[offset_indices + 3 * i + 1] = offset_vertices + i + 2;
		indices[offset_indices + 3 * i + 2] = offset_vertices + i + 1;
	}

	// Since we swapped the last two vertices we also need to change the last triangle.
	indices[offset_indices + 3 * (num_triangles - 1) + 1] = last_vertex;
}